

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O2

void VW::validate_min_max_label(vw *all)

{
  float *pfVar1;
  float fVar2;
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  fVar2 = all->sd->min_label;
  pfVar1 = &all->sd->max_label;
  if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"Max label cannot be less than min label.");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/vw_validate.cc"
             ,0x17,&local_1c0);
  __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void validate_min_max_label(vw& all)
{
  if (all.sd->max_label < all.sd->min_label)
    THROW("Max label cannot be less than min label.");
}